

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O0

void setIntVariable(Variable *variable,int value)

{
  Object *pOVar1;
  int iVar2;
  runtime_error *prVar3;
  long local_58;
  ObjectInt *objectInt;
  ObjectType type;
  Object *object;
  int value_local;
  Variable *variable_local;
  
  if (variable == (Variable *)0x0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"ScriptUtils::setIntVariable => variable is null!");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pOVar1 = variable->value;
  iVar2 = (**pOVar1->_vptr_Object)();
  if ((char)iVar2 == '\0') {
    if (pOVar1 == (Object *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(pOVar1,&Object::typeinfo,&ObjectInt::typeinfo,0);
    }
    *(int *)(local_58 + 8) = value;
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"ScriptUtils::setIntVariable => wrong type!");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void setIntVariable(Variable* variable, int value) {
	if (variable == nullptr) {
		throw std::runtime_error("ScriptUtils::setIntVariable => variable is null!");
	}
	Object* object = variable->value;
	ObjectType type = object->getType();
	if (type == OT_INT) {
		auto *objectInt = dynamic_cast<ObjectInt *>(object);
		objectInt->value = value;
	} else {
		throw std::runtime_error("ScriptUtils::setIntVariable => wrong type!");
	}
}